

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_warm_start(OSQPWorkspace *work,c_int warm_start_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_warm_start");
    return cVar1;
  }
  if (1 < (ulong)warm_start_new) {
    printf("ERROR in %s: ","osqp_update_warm_start");
    printf("warm_start should be either 0 or 1");
    putchar(10);
    return 1;
  }
  work->settings->warm_start = warm_start_new;
  return 0;
}

Assistant:

c_int osqp_update_warm_start(OSQPWorkspace *work, c_int warm_start_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that warm_start is either 0 or 1
  if ((warm_start_new != 0) && (warm_start_new != 1)) {
#ifdef PRINTING
    c_eprint("warm_start should be either 0 or 1");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update warm_start
  work->settings->warm_start = warm_start_new;

  return 0;
}